

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 FormatMount(sxi32 nType,void *pConsumer,ProcConsumer xUserCons,void *pUserData,sxu32 *pOutLen,
                 char *zFormat,__va_list_tag *ap)

{
  undefined8 uVar1;
  sxu32 local_58;
  sxi32 local_54;
  SyFmtConsumer sCons;
  char *zFormat_local;
  sxu32 *pOutLen_local;
  void *pUserData_local;
  ProcConsumer xUserCons_local;
  void *pConsumer_local;
  sxi32 nType_local;
  
  sCons.nLen = 0;
  local_58 = 0;
  if (pOutLen != (sxu32 *)0x0) {
    *pOutLen = 0;
  }
  sCons._8_8_ = xUserCons;
  uVar1 = pUserData;
  if ((nType == 1) ||
     (sCons._8_8_ = pConsumer, uVar1 = sCons.uConsumer.sFunc.xUserConsumer, nType == 6)) {
    sCons.uConsumer.sFunc.xUserConsumer = (ProcConsumer)uVar1;
    local_54 = nType;
    sCons.uConsumer.sFunc.pUserData = zFormat;
    InternFormat(FormatConsumer,&local_58,zFormat,ap);
    if (pOutLen != (sxu32 *)0x0) {
      *pOutLen = local_58;
    }
    pConsumer_local._4_4_ = sCons.nLen;
  }
  else {
    pConsumer_local._4_4_ = 0xfffffff3;
  }
  return pConsumer_local._4_4_;
}

Assistant:

static sxi32 FormatMount(sxi32 nType, void *pConsumer, ProcConsumer xUserCons, void *pUserData, sxu32 *pOutLen, const char *zFormat, va_list ap)
{
	SyFmtConsumer sCons;
	sCons.nType = nType;
	sCons.rc = SXRET_OK;
	sCons.nLen = 0;
	if( pOutLen ){
		*pOutLen = 0;
	}
	switch(nType){
	case SXFMT_CONS_PROC:
#if defined(UNTRUST)
			if( xUserCons == 0 ){
				return SXERR_EMPTY;
			}
#endif
			sCons.uConsumer.sFunc.xUserConsumer = xUserCons;
			sCons.uConsumer.sFunc.pUserData	    = pUserData;
		break;
		case SXFMT_CONS_BLOB:
			sCons.uConsumer.pBlob = (SyBlob *)pConsumer;
			break;
		default: 
			return SXERR_UNKNOWN;
	}
	InternFormat(FormatConsumer, &sCons, zFormat, ap); 
	if( pOutLen ){
		*pOutLen = sCons.nLen;
	}
	return sCons.rc;
}